

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O1

ConversionResult
llvm::ConvertUTF16toUTF8
          (UTF16 **sourceStart,UTF16 *sourceEnd,UTF8 **targetStart,UTF8 *targetEnd,
          ConversionFlags flags)

{
  UTF8 *pUVar1;
  bool bVar2;
  ConversionResult CVar3;
  ushort uVar4;
  int iVar5;
  ushort *puVar6;
  uint uVar7;
  UTF16 *oldSource;
  ushort *puVar8;
  
  pUVar1 = *targetStart;
  CVar3 = conversionOK;
  puVar8 = *sourceStart;
  do {
    puVar6 = puVar8;
    if (sourceEnd <= puVar8) break;
    puVar6 = puVar8 + 1;
    uVar7 = (uint)*puVar8;
    if ((uVar7 & 0xfc00) == 0xd800) {
      if (puVar6 < sourceEnd) {
        if ((*puVar6 & 0xfc00) == 0xdc00) {
          uVar7 = (uint)*puVar8 * 0x400 + (uint)*puVar6 + 0xfca02400;
          puVar6 = puVar8 + 2;
LAB_00191239:
          iVar5 = 0;
          bVar2 = true;
        }
        else {
          if (flags != strictConversion) goto LAB_00191239;
          CVar3 = sourceIllegal;
          bVar2 = false;
          iVar5 = 3;
          puVar6 = puVar8;
        }
        if (bVar2) goto LAB_00191245;
      }
      else {
        CVar3 = sourceExhausted;
LAB_00191285:
        iVar5 = 3;
        puVar6 = puVar8;
      }
    }
    else {
      if ((flags != strictConversion) || (iVar5 = 3, (uVar7 & 0xfc00) != 0xdc00)) {
LAB_00191245:
        uVar4 = 1;
        if ((0x7f < uVar7) && (uVar4 = 2, 0x7ff < uVar7)) {
          uVar4 = 4 - (uVar7 < 0x10000);
        }
        if (pUVar1 + uVar4 <= targetEnd) {
          CVar3 = (*(code *)(&DAT_001bd230 + *(int *)(&DAT_001bd230 + (ulong)(uVar4 - 1) * 4)))();
          return CVar3;
        }
        CVar3 = targetExhausted;
        goto LAB_00191285;
      }
      CVar3 = sourceIllegal;
      puVar6 = puVar8;
    }
    puVar8 = puVar6;
  } while (iVar5 == 0);
  *sourceStart = puVar6;
  *targetStart = pUVar1;
  return CVar3;
}

Assistant:

ConversionResult ConvertUTF16toUTF8 (
        const UTF16** sourceStart, const UTF16* sourceEnd,
        UTF8** targetStart, UTF8* targetEnd, ConversionFlags flags) {
    ConversionResult result = conversionOK;
    const UTF16* source = *sourceStart;
    UTF8* target = *targetStart;
    while (source < sourceEnd) {
        UTF32 ch;
        unsigned short bytesToWrite = 0;
        const UTF32 byteMask = 0xBF;
        const UTF32 byteMark = 0x80;
        const UTF16* oldSource = source; /* In case we have to back up because of target overflow. */
        ch = *source++;
        /* If we have a surrogate pair, convert to UTF32 first. */
        if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_HIGH_END) {
            /* If the 16 bits following the high surrogate are in the source buffer... */
            if (source < sourceEnd) {
                UTF32 ch2 = *source;
                /* If it's a low surrogate, convert to UTF32. */
                if (ch2 >= UNI_SUR_LOW_START && ch2 <= UNI_SUR_LOW_END) {
                    ch = ((ch - UNI_SUR_HIGH_START) << halfShift)
                        + (ch2 - UNI_SUR_LOW_START) + halfBase;
                    ++source;
                } else if (flags == strictConversion) { /* it's an unpaired high surrogate */
                    --source; /* return to the illegal value itself */
                    result = sourceIllegal;
                    break;
                }
            } else { /* We don't have the 16 bits following the high surrogate. */
                --source; /* return to the high surrogate */
                result = sourceExhausted;
                break;
            }
        } else if (flags == strictConversion) {
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_LOW_START && ch <= UNI_SUR_LOW_END) {
                --source; /* return to the illegal value itself */
                result = sourceIllegal;
                break;
            }
        }
        /* Figure out how many bytes the result will require */
        if (ch < (UTF32)0x80) {      bytesToWrite = 1;
        } else if (ch < (UTF32)0x800) {     bytesToWrite = 2;
        } else if (ch < (UTF32)0x10000) {   bytesToWrite = 3;
        } else if (ch < (UTF32)0x110000) {  bytesToWrite = 4;
        } else {                            bytesToWrite = 3;
                                            ch = UNI_REPLACEMENT_CHAR;
        }

        target += bytesToWrite;
        if (target > targetEnd) {
            source = oldSource; /* Back up source pointer! */
            target -= bytesToWrite; result = targetExhausted; break;
        }
        switch (bytesToWrite) { /* note: everything falls through. */
            case 4: *--target = (UTF8)((ch | byteMark) & byteMask); ch >>= 6;
            case 3: *--target = (UTF8)((ch | byteMark) & byteMask); ch >>= 6;
            case 2: *--target = (UTF8)((ch | byteMark) & byteMask); ch >>= 6;
            case 1: *--target =  (UTF8)(ch | firstByteMark[bytesToWrite]);
        }
        target += bytesToWrite;
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}